

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flag_complex_edge_collapser.h
# Opt level: O3

bool __thiscall
Gudhi::collapse::Flag_complex_edge_collapser<short,float>::
is_dominated_by<boost::container::flat_set<short,std::less<short>,void>>
          (Flag_complex_edge_collapser<short,float> *this,
          flat_set<short,_std::less<short>,_void> *e_ngb,short c,float f)

{
  short *psVar1;
  short *psVar2;
  stored_size_type sVar3;
  long lVar4;
  short *psVar5;
  long lVar6;
  undefined6 in_register_00000012;
  short *psVar7;
  
  sVar3 = (e_ngb->
          super_flat_tree<short,_boost::move_detail::identity<short>,_std::less<short>,_void>).
          m_data.m_seq.m_holder.m_size;
  if (sVar3 == 0) {
    __assert_fail("eni != ene",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Collapse/include/gudhi/Flag_complex_edge_collapser.h"
                  ,0xa5,
                  "bool Gudhi::collapse::Flag_complex_edge_collapser<short, float>::is_dominated_by(const Ngb &, Vertex, Filtration_value) [Vertex = short, Filtration_value = float, Ngb = boost::container::flat_set<short>]"
                 );
  }
  lVar6 = (long)(int)CONCAT62(in_register_00000012,c);
  lVar4 = *(long *)(*(long *)this + 8 + lVar6 * 0x18);
  if (lVar4 == 0) {
    __assert_fail("ci != ce",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Collapse/include/gudhi/Flag_complex_edge_collapser.h"
                  ,0xa6,
                  "bool Gudhi::collapse::Flag_complex_edge_collapser<short, float>::is_dominated_by(const Ngb &, Vertex, Filtration_value) [Vertex = short, Filtration_value = float, Ngb = boost::container::flat_set<short>]"
                 );
  }
  psVar5 = *(short **)(*(long *)this + lVar6 * 0x18);
  psVar1 = psVar5 + lVar4 * 4;
  psVar7 = (e_ngb->
           super_flat_tree<short,_boost::move_detail::identity<short>,_std::less<short>,_void>).
           m_data.m_seq.m_holder.m_start;
  psVar2 = psVar7 + sVar3;
  while( true ) {
    if (psVar7 == (short *)0x0) {
      __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                    "reference boost::container::vec_iterator<short *, true>::operator*() const [Pointer = short *, IsConst = true]"
                   );
    }
    while (*psVar5 < *psVar7) {
      psVar5 = psVar5 + 4;
      if (psVar5 == psVar1) {
        return false;
      }
    }
    if (*psVar7 < *psVar5) {
      return false;
    }
    if (f < *(float *)(psVar5 + 2)) {
      return false;
    }
    psVar7 = psVar7 + 1;
    if (psVar7 == psVar2) break;
    psVar5 = psVar5 + 4;
    if (psVar5 == psVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool is_dominated_by(Ngb const& e_ngb, Vertex c, Filtration_value f){
    // The best strategy probably depends on the distribution, how sparse / dense the adjacency matrix is,
    // how (un)balanced the sizes of e_ngb and nc are.
    // Some efficient operations on sets work best with bitsets, although the need for a map complicates things.
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
    for(auto v : e_ngb) {
      // if(v==c)continue;
      if(neighbors_dense(v,c) > f) return false;
    }
    return true;
#else
    auto&&nc = neighbors[c];
    // if few neighbors, use dichotomy? Seems slower.
    // I tried storing a copy of neighbors as a vector<absl::flat_hash_map> and using it for nc, but it was
    // a bit slower here. It did help with neighbors[dominator].find(w) in the main function though,
    // sometimes enough, sometimes not.
    auto ci = nc.begin();
    auto ce = nc.end();
    auto eni = e_ngb.begin();
    auto ene = e_ngb.end();
    assert(eni != ene);
    assert(ci != ce);
    // if(*eni == c && ++eni == ene) return true;
    for(;;){
      Vertex ve = *eni;
      Vertex vc = ci->first;
      while(ve > vc) {
        // try a gallop strategy (exponential search)? Seems slower
        if(++ci == ce) return false;
        vc = ci->first;
      }
      if(ve < vc) return false;
      // ve == vc
      if(ci->second > f) return false;
      if(++eni == ene)return true;
      // If we stored an open neighborhood of c (excluding c), we would need to test for c here and before the loop
      // if(*eni == c && ++eni == ene)return true;
      if(++ci == ce) return false;
    }
#endif
  }